

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::SetTabItemClosed(char *label)

{
  ImGuiTabItem *pIVar1;
  ImGuiTabItem *tab;
  ImGuiID tab_id;
  ImGuiTabBar *tab_bar;
  bool is_within_manual_tab_bar;
  ImGuiContext *g;
  undefined7 in_stack_ffffffffffffffc8;
  byte bVar2;
  char *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  bVar2 = 0;
  if (GImGui->CurrentTabBar != (ImGuiTabBar *)0x0) {
    bVar2 = (GImGui->CurrentTabBar->Flags & 0x100000U) != 0 ^ 0xff;
  }
  if ((bVar2 & 1) != 0) {
    TabBarCalcTabID((ImGuiTabBar *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                    in_stack_ffffffffffffffd0);
    pIVar1 = TabBarFindTabByID((ImGuiTabBar *)CONCAT17(bVar2,in_stack_ffffffffffffffc8),0);
    if (pIVar1 != (ImGuiTabItem *)0x0) {
      pIVar1->WantClose = true;
    }
  }
  return;
}

Assistant:

void    ImGui::SetTabItemClosed(const char* label)
{
    ImGuiContext& g = *GImGui;
    bool is_within_manual_tab_bar = g.CurrentTabBar && !(g.CurrentTabBar->Flags & ImGuiTabBarFlags_DockNode);
    if (is_within_manual_tab_bar)
    {
        ImGuiTabBar* tab_bar = g.CurrentTabBar;
        ImGuiID tab_id = TabBarCalcTabID(tab_bar, label);
        if (ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, tab_id))
            tab->WantClose = true; // Will be processed by next call to TabBarLayout()
    }
}